

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O1

Map<String,_String> * Process::getEnvironmentVariables(void)

{
  char *pcVar1;
  usize *puVar2;
  char cVar3;
  long lVar4;
  char *pcVar5;
  usize length;
  long lVar6;
  Map<String,_String> *in_RDI;
  char *e;
  char *str;
  String value;
  String var;
  String local_80;
  String local_58;
  
  (in_RDI->_end).item = &in_RDI->endItem;
  (in_RDI->_begin).item = &in_RDI->endItem;
  in_RDI->root = (Item *)0x0;
  in_RDI->_size = 0;
  (in_RDI->endItem).key.data = &String::emptyData.super_Data;
  (in_RDI->endItem).value.data = &String::emptyData.super_Data;
  (in_RDI->endItem).parent = (Item *)0x0;
  (in_RDI->endItem).next = (Item *)0x0;
  (in_RDI->endItem).prev = (Item *)0x0;
  in_RDI->freeItem = (Item *)0x0;
  in_RDI->blocks = (ItemBlock *)0x0;
  str = (char *)*_environ;
  if (str != (char *)0x0) {
    lVar6 = 0;
    do {
      cVar3 = *str;
      pcVar5 = str;
      while (cVar3 != '\0') {
        if (cVar3 == '=') goto LAB_0010a8ac;
        pcVar1 = pcVar5 + 1;
        pcVar5 = pcVar5 + 1;
        cVar3 = *pcVar1;
      }
      pcVar5 = (char *)0x0;
LAB_0010a8ac:
      if (pcVar5 != (char *)0x0) {
        local_58.data = &String::emptyData.super_Data;
        String::attach(&local_58,str,(long)pcVar5 - (long)str);
        local_80.data = &String::emptyData.super_Data;
        length = 0xffffffffffffffff;
        do {
          lVar4 = length + 2;
          length = length + 1;
        } while (str[lVar4] != '\0');
        String::attach(&local_80,str + 1,length);
        Map<String,_String>::insert(in_RDI,&in_RDI->root,(Item *)0x0,&local_58,&local_80);
        if ((local_80.data)->ref != 0) {
          LOCK();
          puVar2 = &(local_80.data)->ref;
          *puVar2 = *puVar2 - 1;
          UNLOCK();
          if ((*puVar2 == 0) && (local_80.data != (Data *)0x0)) {
            operator_delete__(local_80.data);
          }
        }
        if ((local_58.data)->ref != 0) {
          LOCK();
          puVar2 = &(local_58.data)->ref;
          *puVar2 = *puVar2 - 1;
          UNLOCK();
          if ((*puVar2 == 0) && (local_58.data != (Data *)0x0)) {
            operator_delete__(local_58.data);
          }
        }
      }
      str = (char *)_environ[lVar6 + 1];
      lVar6 = lVar6 + 1;
    } while (str != (char *)0x0);
  }
  return in_RDI;
}

Assistant:

Map<String, String> Process::getEnvironmentVariables()
{
#ifdef _WIN32
  Map<String, String> result;
  LPTCH environmentStrings = GetEnvironmentStrings();
  if (!environmentStrings)
    return result;
  struct Guard
  {
    LPTCH _environmentStrings;
    ~Guard() { FreeEnvironmentStrings(_environmentStrings); }
  } guard = { environmentStrings };

  for (LPTCH i = environmentStrings; *i != '\0'; ++i)
  {
    String key;
    String value;

    for (; *i != '='; ++i)
      key += *i;
    ++i;
    for (; *i != '\0'; ++i)
        value += *i;

    if (key.isEmpty())
      continue;
    result.insert(key, value);
  }
  return result;
#else
  Map<String, String> result;
  for (size_t i = 0; environ[i]; ++i)
  {
    const char* e = environ[i];
    const char* x = String::find(e, '=');
    if (!x)
      continue;
    String var;
    var.attach(e, x - e);
    String value;
    ++e;
    value.attach(e, String::length(e));
    result.insert(var, value);
  }
  return result;
#endif
}